

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  ulong uVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  lua_Integer lVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  long n;
  ulong uVar11;
  size_t upto;
  ulong uVar12;
  char *__s2;
  size_t lp;
  size_t ls;
  MatchState ms;
  ulong local_270;
  char *local_268;
  ulong local_260;
  MatchState local_258;
  
  pcVar5 = luaL_checklstring(L,1,&local_260);
  pcVar6 = luaL_checklstring(L,2,&local_270);
  lVar7 = luaL_optinteger(L,3,1);
  n = lVar7;
  if ((lVar7 < 1) &&
     (n = 1, SBORROW8(lVar7,-local_260) == (long)(lVar7 + local_260) < 0 && lVar7 != 0)) {
    n = lVar7 + 1 + local_260;
  }
  uVar1 = n - 1;
  if (uVar1 <= local_260) {
    uVar11 = local_270;
    if (find == 0) {
LAB_00142cf4:
      cVar2 = *pcVar6;
      if (cVar2 == '^') {
        uVar11 = uVar11 - 1;
        pcVar6 = pcVar6 + 1;
        local_270 = uVar11;
      }
      local_258.p_end = pcVar6 + uVar11;
      local_258.matchdepth = 200;
      local_258.src_end = pcVar5 + local_260;
      local_258.src_init = pcVar5;
      local_258.L = L;
      do {
        local_258.level = '\0';
        if (local_258.matchdepth != 200) {
          __assert_fail("ms->matchdepth == 200",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstrlib.c"
                        ,0x2fe,"void reprepstate(MatchState *)");
        }
        lVar3 = n + -1;
        pcVar10 = match(&local_258,pcVar5 + lVar3,pcVar6);
        if (pcVar10 != (char *)0x0) {
          if (find != 0) {
            lua_pushinteger(L,n);
            lua_pushinteger(L,(long)pcVar10 - (long)pcVar5);
            iVar4 = push_captures(&local_258,(char *)0x0,(char *)0x0);
            return iVar4 + 2;
          }
          iVar4 = push_captures(&local_258,pcVar5 + n + -1,pcVar10);
          return iVar4;
        }
      } while ((cVar2 != '^') && (n = n + 1, pcVar5 + lVar3 < local_258.src_end));
    }
    else {
      local_268 = pcVar6;
      iVar4 = lua_toboolean(L,4);
      uVar11 = local_270;
      if (iVar4 == 0) {
        uVar12 = 0;
        do {
          pcVar10 = local_268 + uVar12;
          pcVar8 = strpbrk(pcVar10,"^$*+?.([%-");
          pcVar6 = local_268;
          if (pcVar8 != (char *)0x0) goto LAB_00142cf4;
          sVar9 = strlen(pcVar10);
          uVar12 = uVar12 + 1 + sVar9;
        } while (uVar12 <= uVar11);
      }
      pcVar6 = pcVar5 + uVar1;
      if (uVar11 == 0) {
        if (pcVar5 != (char *)0x0) {
LAB_00142deb:
          lua_pushinteger(L,(lua_Integer)(pcVar6 + (1 - (long)pcVar5)));
          lua_pushinteger(L,(lua_Integer)(pcVar6 + (local_270 - (long)pcVar5)));
          return 2;
        }
      }
      else if (uVar11 <= local_260 - uVar1) {
        pcVar10 = (char *)((local_260 - uVar1) - (uVar11 - 1));
        if (pcVar10 != (char *)0x0) {
          cVar2 = *local_268;
          __s2 = local_268 + 1;
          pcVar8 = pcVar6;
          do {
            pcVar6 = (char *)memchr(pcVar8,(int)cVar2,(size_t)pcVar10);
            if (pcVar6 == (char *)0x0) break;
            __s1 = pcVar6 + 1;
            iVar4 = bcmp(__s1,__s2,uVar11 - 1);
            if (iVar4 == 0) goto LAB_00142deb;
            pcVar10 = pcVar8 + ((long)pcVar10 - (long)__s1);
            pcVar8 = __s1;
          } while (pcVar10 != (char *)0x0);
        }
      }
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelatI(luaL_optinteger(L, 3, 1), ls) - 1;
  if (init > ls) {  /* start after string's end? */
    luaL_pushfail(L);  /* cannot find anything */
    return 1;
  }
  /* explicit request or no special characters? */
  if (find && (lua_toboolean(L, 4) || nospecials(p, lp))) {
    /* do a plain search */
    const char *s2 = lmemfind(s + init, ls - init, p, lp);
    if (s2) {
      lua_pushinteger(L, (s2 - s) + 1);
      lua_pushinteger(L, (s2 - s) + lp);
      return 2;
    }
  }
  else {
    MatchState ms;
    const char *s1 = s + init;
    int anchor = (*p == '^');
    if (anchor) {
      p++; lp--;  /* skip anchor character */
    }
    prepstate(&ms, L, s, ls, p, lp);
    do {
      const char *res;
      reprepstate(&ms);
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, (s1 - s) + 1);  /* start */
          lua_pushinteger(L, res - s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  luaL_pushfail(L);  /* not found */
  return 1;
}